

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Balanced
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index,bool update)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  CounterStatus CVar4;
  uint uVar5;
  VkResult VVar6;
  ulong *puVar7;
  undefined4 extraout_var;
  VmaDefragmentationContext_T *pVVar8;
  VkDeviceSize VVar9;
  ulong uVar10;
  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *pVVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar12;
  byte in_CL;
  VmaBlockVector *in_RDX;
  undefined8 in_RSI;
  VmaDefragmentationContext_T *in_RDI;
  VmaAllocationRequest request;
  VkDeviceSize offset;
  VkDeviceSize nextFreeRegionSize;
  size_t prevMoveCount;
  MoveAllocationData moveData;
  VmaAllocHandle handle;
  VkDeviceSize prevFreeRegionSize;
  VmaBlockMetadata *metadata;
  VmaDeviceMemoryBlock *block;
  size_t i;
  VkDeviceSize minimalFreeRegion;
  size_t startMoveCount;
  StateBalanced *vectorState;
  undefined1 *in_stack_fffffffffffffee8;
  VmaBlockVector *in_stack_fffffffffffffef0;
  VmaAllocation_T *in_stack_fffffffffffffef8;
  size_t sVar13;
  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>
  *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  VmaBlockVector *in_stack_ffffffffffffff18;
  VmaDefragmentationContext_T *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  VmaAllocationCreateFlags in_stack_ffffffffffffff2c;
  VmaListItem<VmaSuballocation> *in_stack_ffffffffffffff30;
  VmaDeviceMemoryBlock *pBlock;
  VmaAllocationRequest *allocRequest;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffff4c;
  VmaSuballocationType suballocType;
  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *pVVar15;
  VmaAllocation *in_stack_ffffffffffffff68;
  undefined8 local_90;
  uint local_88;
  VmaAllocation_T *local_78;
  VmaPool local_68;
  ulong local_60;
  VmaBlockMetadata *local_58;
  VmaDeviceMemoryBlock *local_50;
  size_t local_48;
  ulong local_40;
  size_t local_38;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 local_1;
  undefined4 extraout_var_00;
  
  bVar1 = in_CL & 1;
  puVar7 = (ulong *)((long)in_RDI->m_AlgorithmState + (long)in_RDX * 0x10);
  if ((bVar1 != 0) && (puVar7[1] == 0xffffffffffffffff)) {
    UpdateVectorStatistics
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(StateBalanced *)in_RDI);
  }
  local_38 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                       (&in_RDI->m_Moves);
  local_40 = *puVar7 >> 1;
  local_48 = VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2fa3f1);
  do {
    local_48 = local_48 - 1;
    if (local_48 <= in_RDI->m_ImmovableBlockCount) {
      sVar13 = local_38;
      sVar12 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                         (&in_RDI->m_Moves);
      if ((sVar13 == sVar12) && ((bVar1 & 1) == 0)) {
        puVar7[1] = 0xffffffffffffffff;
        local_1 = ComputeDefragmentation_Balanced
                            ((VmaDefragmentationContext_T *)in_RSI,in_RDX,
                             CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                             SUB81((ulong)puVar7 >> 0x38,0));
      }
      else {
        local_1 = false;
      }
      return (bool)local_1;
    }
    local_50 = VmaBlockVector::GetBlock(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8)
    ;
    local_58 = local_50->m_pMetadata;
    local_60 = 0;
    iVar3 = (*local_58->_vptr_VmaBlockMetadata[0xb])();
    local_68 = (VmaPool)CONCAT44(extraout_var,iVar3);
    while (local_68 != (VmaPool)0x0) {
      GetMoveData((VmaAllocHandle)in_stack_ffffffffffffff00,
                  (VmaBlockMetadata *)in_stack_fffffffffffffef8);
      pVVar8 = (VmaDefragmentationContext_T *)VmaAllocation_T::GetUserData(local_78);
      uVar10 = local_60;
      if (pVVar8 != in_RDI) {
        VVar9 = VmaAllocation_T::GetSize(local_78);
        CVar4 = CheckCounters(in_RDI,VVar9);
        if (CVar4 != Pass) {
          uVar10 = local_60;
          if (CVar4 == Ignore) goto LAB_002fa760;
          if (CVar4 == End) {
            return true;
          }
        }
        in_stack_ffffffffffffff00 =
             (VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
             VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                       (&in_RDI->m_Moves);
        bVar2 = AllocInOtherBlock((VmaDefragmentationContext_T *)
                                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                  (size_t)in_stack_ffffffffffffff20,
                                  (size_t)in_stack_ffffffffffffff18,(MoveAllocationData *)in_RDI,
                                  (VmaBlockVector *)CONCAT44(CVar4,in_stack_ffffffffffffff08));
        if (bVar2) {
          return true;
        }
        iVar3 = (*local_58->_vptr_VmaBlockMetadata[0xd])(local_58,local_68);
        uVar10 = CONCAT44(extraout_var_00,iVar3);
        VVar9 = VmaAllocation_T::GetOffset(in_stack_fffffffffffffef8);
        pVVar15 = in_stack_ffffffffffffff00;
        pVVar11 = (VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
                  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                            (&in_RDI->m_Moves);
        suballocType = (VmaSuballocationType)pVVar15;
        if ((((in_stack_ffffffffffffff00 == pVVar11) && (VVar9 != 0)) &&
            (iVar3 = (*local_58->_vptr_VmaBlockMetadata[6])(),
            in_stack_ffffffffffffff68 <= (VmaAllocation *)CONCAT44(extraout_var_01,iVar3))) &&
           (((local_40 <= local_60 || (local_40 <= uVar10)) ||
            ((in_stack_ffffffffffffff68 <= (VmaAllocation *)*puVar7 ||
             (in_stack_ffffffffffffff68 <= (VmaAllocation *)puVar7[1])))))) {
          in_stack_ffffffffffffff18 = (VmaBlockVector *)0x0;
          in_stack_ffffffffffffff20 = (VmaDefragmentationContext_T *)0x0;
          VmaList<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::iterator::iterator
                    ((iterator *)&stack0xffffffffffffff28);
          pBlock = (VmaDeviceMemoryBlock *)0x0;
          allocRequest = (VmaAllocationRequest *)0x0;
          uVar14 = 0;
          in_stack_fffffffffffffee8 = &stack0xffffffffffffff18;
          uVar5 = (*local_58->_vptr_VmaBlockMetadata[0x11])
                            (local_58,in_stack_ffffffffffffff68,local_90,0,(ulong)local_88,0x40000);
          if (((uVar5 & 1) != 0) &&
             (iVar3 = (*local_58->_vptr_VmaBlockMetadata[9])(local_58,in_stack_ffffffffffffff18),
             CONCAT44(extraout_var_02,iVar3) < VVar9)) {
            in_stack_fffffffffffffef0 = (VmaBlockVector *)&stack0xffffffffffffff90;
            in_stack_fffffffffffffee8 =
                 (undefined1 *)CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),local_88);
            VVar6 = VmaBlockVector::CommitAllocationRequest
                              ((VmaBlockVector *)CONCAT44(in_stack_ffffffffffffff4c,uVar14),
                               allocRequest,pBlock,(VkDeviceSize)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,suballocType,
                               in_stack_ffffffffffffff68);
            if (VVar6 == VK_SUCCESS) {
              VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::push_back
                        (in_stack_ffffffffffffff00,
                         (VmaDefragmentationMove *)in_stack_fffffffffffffef8);
              bVar2 = IncrementCounters(in_RDI,(VkDeviceSize)in_stack_ffffffffffffff68);
              if (bVar2) {
                return true;
              }
            }
          }
        }
      }
LAB_002fa760:
      local_60 = uVar10;
      iVar3 = (*local_58->_vptr_VmaBlockMetadata[0xc])(local_58,local_68);
      local_68 = (VmaPool)CONCAT44(extraout_var_03,iVar3);
    }
  } while( true );
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Balanced(VmaBlockVector& vector, size_t index, bool update)
{
    // Go over every allocation and try to fit it in previous blocks at lowest offsets,
    // if not possible: realloc within single block to minimize offset (exclude offset == 0),
    // but only if there are noticable gaps between them (some heuristic, ex. average size of allocation in block)
    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateBalanced& vectorState = reinterpret_cast<StateBalanced*>(m_AlgorithmState)[index];
    if (update && vectorState.avgAllocSize == UINT64_MAX)
        UpdateVectorStatistics(vector, vectorState);

    const size_t startMoveCount = m_Moves.size();
    VkDeviceSize minimalFreeRegion = vectorState.avgFreeSize / 2;
    for (size_t i = vector.GetBlockCount() - 1; i > m_ImmovableBlockCount; --i)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(i);
        VmaBlockMetadata* metadata = block->m_pMetadata;
        VkDeviceSize prevFreeRegionSize = 0;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            const size_t prevMoveCount = m_Moves.size();
            if (AllocInOtherBlock(0, i, moveData, vector))
                return true;

            VkDeviceSize nextFreeRegionSize = metadata->GetNextFreeRegionSize(handle);
            // If no room found then realloc within block for lower offset
            VkDeviceSize offset = moveData.move.srcAllocation->GetOffset();
            if (prevMoveCount == m_Moves.size() && offset != 0 && metadata->GetSumFreeSize() >= moveData.size)
            {
                // Check if realloc will make sense
                if (prevFreeRegionSize >= minimalFreeRegion ||
                    nextFreeRegionSize >= minimalFreeRegion ||
                    moveData.size <= vectorState.avgFreeSize ||
                    moveData.size <= vectorState.avgAllocSize)
                {
                    VmaAllocationRequest request = {};
                    if (metadata->CreateAllocationRequest(
                        moveData.size,
                        moveData.alignment,
                        false,
                        moveData.type,
                        VMA_ALLOCATION_CREATE_STRATEGY_MIN_OFFSET_BIT,
                        &request))
                    {
                        if (metadata->GetAllocationOffset(request.allocHandle) < offset)
                        {
                            if (vector.CommitAllocationRequest(
                                request,
                                block,
                                moveData.alignment,
                                moveData.flags,
                                this,
                                moveData.type,
                                &moveData.move.dstTmpAllocation) == VK_SUCCESS)
                            {
                                m_Moves.push_back(moveData.move);
                                if (IncrementCounters(moveData.size))
                                    return true;
                            }
                        }
                    }
                }
            }
            prevFreeRegionSize = nextFreeRegionSize;
        }
    }
    
    // No moves perfomed, update statistics to current vector state
    if (startMoveCount == m_Moves.size() && !update)
    {
        vectorState.avgAllocSize = UINT64_MAX;
        return ComputeDefragmentation_Balanced(vector, index, false);
    }
    return false;
}